

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Data * fts5LeafRead(Fts5Index *p,i64 iRowid)

{
  Fts5Data *local_20;
  Fts5Data *pRet;
  i64 iRowid_local;
  Fts5Index *p_local;
  
  local_20 = fts5DataRead(p,iRowid);
  if ((local_20 != (Fts5Data *)0x0) && (local_20->nn < local_20->szLeaf)) {
    p->rc = 0x10b;
    fts5DataRelease(local_20);
    local_20 = (Fts5Data *)0x0;
  }
  return local_20;
}

Assistant:

static Fts5Data *fts5LeafRead(Fts5Index *p, i64 iRowid){
  Fts5Data *pRet = fts5DataRead(p, iRowid);
  if( pRet ){
    if( pRet->szLeaf>pRet->nn ){
      p->rc = FTS5_CORRUPT;
      fts5DataRelease(pRet);
      pRet = 0;
    }
  }
  return pRet;
}